

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O3

ze_result_t loader::zesEngineGetActivity(zes_engine_handle_t hEngine,zes_engine_stats_t *pStats)

{
  ze_result_t zVar1;
  
  if (*(code **)(*(long *)(hEngine + 8) + 0xb68) != (code *)0x0) {
    zVar1 = (**(code **)(*(long *)(hEngine + 8) + 0xb68))(*(undefined8 *)hEngine);
    return zVar1;
  }
  return ZE_RESULT_ERROR_UNINITIALIZED;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesEngineGetActivity(
        zes_engine_handle_t hEngine,                    ///< [in] Handle for the component.
        zes_engine_stats_t* pStats                      ///< [in,out] Will contain a snapshot of the engine group activity
                                                        ///< counters.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zes_engine_object_t*>( hEngine )->dditable;
        auto pfnGetActivity = dditable->zes.Engine.pfnGetActivity;
        if( nullptr == pfnGetActivity )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hEngine = reinterpret_cast<zes_engine_object_t*>( hEngine )->handle;

        // forward to device-driver
        result = pfnGetActivity( hEngine, pStats );

        return result;
    }